

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsBuiltInEngineInterfaceExtensionObject.cpp
# Opt level: O2

Var Js::JsBuiltInEngineInterfaceExtensionObject::EntryJsBuiltIn_RegisterFunction
              (RecyclableObject *function,CallInfo callInfo,...)

{
  int iVar1;
  int iVar2;
  ScriptContext *pSVar3;
  code *pcVar4;
  bool bVar5;
  undefined4 *puVar6;
  JavascriptString *pJVar7;
  JavascriptString *pstLeft;
  EngineExtensionObjectBase *pEVar8;
  undefined7 uVar11;
  long lVar9;
  PropertyString *pstLeft_00;
  PropertyString *pstCenter;
  ScriptFunction *pSVar10;
  uint uVar12;
  PropertyId PVar13;
  DynamicObject *object;
  Type *this;
  JavascriptLibrary *this_00;
  uint in_stack_00000010;
  Var in_stack_00000020;
  Var in_stack_00000028;
  long local_60;
  PropertyRecord *methodPropertyRecord;
  undefined8 local_50;
  DynamicObject *local_48;
  int local_3c;
  ScriptContext *local_38;
  
  pSVar3 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  ThreadContext::ProbeStack(pSVar3->threadContext,0xc00,pSVar3,(PVOID)0x0);
  uVar12 = callInfo._0_4_;
  if (in_stack_00000010 != uVar12) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JsBuiltInEngineInterfaceExtensionObject.cpp"
                                ,0x11c,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar5) goto LAB_00bd078a;
    *puVar6 = 0;
  }
  if ((uVar12 >> 0x18 & 1) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JsBuiltInEngineInterfaceExtensionObject.cpp"
                                ,0x11c,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar5) goto LAB_00bd078a;
    *puVar6 = 0;
  }
  local_38 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
             scriptContext.ptr;
  if ((uVar12 & 0xffffff) == 3) {
    bVar5 = VarIs<Js::ScriptFunction>(in_stack_00000028);
    if (!bVar5) goto LAB_00bd0403;
  }
  else {
    if (((ulong)callInfo & 0xffffff) == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JsBuiltInEngineInterfaceExtensionObject.cpp"
                                  ,0x11c,"(argCount > 0)","Should always have implicit \'this\'");
      if (!bVar5) goto LAB_00bd078a;
      *puVar6 = 0;
    }
LAB_00bd0403:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JsBuiltInEngineInterfaceExtensionObject.cpp"
                                ,0x11e,
                                "(args.Info.Count == 3 && VarIs<ScriptFunction>(args.Values[2]))",
                                "args.Info.Count == 3 && VarIs<ScriptFunction>(args.Values[2])");
    if (!bVar5) goto LAB_00bd078a;
    *puVar6 = 0;
  }
  pSVar3 = local_38;
  this_00 = (local_38->super_ScriptContextBase).javascriptLibrary;
  pJVar7 = VarTo<Js::JavascriptString>(in_stack_00000020);
  local_60 = 0;
  local_50 = 0;
  (*(pJVar7->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x61])(pJVar7,&local_60,0);
  iVar1 = *(int *)(local_60 + 8);
  pstLeft = StringCache::GetDot(&this_00->stringCache);
  pEVar8 = EngineInterfaceObject::GetEngineExtension
                     ((((pSVar3->super_ScriptContextBase).javascriptLibrary)->
                      super_JavascriptLibraryBase).engineInterfaceObject.ptr,
                      EngineInterfaceExtensionKind_JsBuiltIn);
  iVar2 = *(int *)&pEVar8[2]._vptr_EngineExtensionObjectBase;
  local_3c = iVar1;
  if (iVar2 == 0) {
    PVar13 = 0x4f;
    lVar9 = 0x1f0;
LAB_00bd04f5:
    local_48 = *(DynamicObject **)
                ((long)&(this_00->super_JavascriptLibraryBase).super_FinalizableObject.
                        super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject + lVar9);
    pstLeft_00 = ScriptContext::GetPropertyString(local_38,PVar13);
  }
  else {
    uVar11 = (undefined7)((ulong)pEVar8 >> 8);
    if (iVar2 == 2) {
      local_50 = CONCAT71(uVar11,1);
      PVar13 = 0x111;
      lVar9 = 0xc0;
      goto LAB_00bd04f5;
    }
    if (iVar2 == 1) {
      local_50 = CONCAT71(uVar11,1);
      PVar13 = 0xd7;
      lVar9 = 0x1b8;
      goto LAB_00bd04f5;
    }
    pstLeft_00 = (PropertyString *)0x0;
    local_48 = (DynamicObject *)0x0;
  }
  if (((local_3c == 0x10) || (pstLeft_00 == (PropertyString *)0x0)) ||
     (local_48 == (DynamicObject *)0x0)) {
    AssertCount = AssertCount + 1;
    methodPropertyRecord = (PropertyRecord *)this_00;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JsBuiltInEngineInterfaceExtensionObject.cpp"
                                ,0x13c,
                                "(methodString && classPropString && installTarget && methodPropID != PropertyIds::_none)"
                                ,
                                "methodString && classPropString && installTarget && methodPropID != PropertyIds::_none"
                               );
    if (!bVar5) {
LAB_00bd078a:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar6 = 0;
    this_00 = (JavascriptLibrary *)methodPropertyRecord;
  }
  if ((char)local_50 == '\0') {
    pstCenter = ScriptContext::GetPropertyString(local_38,0x124);
    pstLeft = JavascriptString::Concat3(pstLeft,&pstCenter->super_JavascriptString,pstLeft);
  }
  pJVar7 = JavascriptString::Concat3(&pstLeft_00->super_JavascriptString,pstLeft,pJVar7);
  pSVar10 = UnsafeVarTo<Js::ScriptFunction>(in_stack_00000028);
  pSVar10 = EngineInterfaceObject::CreateLibraryCodeScriptFunction(pSVar10,pJVar7,false,true,true);
  iVar1 = local_3c;
  JavascriptLibrary::AddMember(this_00,local_48,local_3c,pSVar10);
  if (iVar2 == 1) {
    if (iVar1 == 0x2a) {
      Memory::WriteBarrierPtr<Js::JavascriptFunction>::WriteBarrierSet
                (&(this_00->super_JavascriptLibraryBase).mathMin,(JavascriptFunction *)pSVar10);
      object = (((((local_38->super_ScriptContextBase).javascriptLibrary)->
                 super_JavascriptLibraryBase).engineInterfaceObject.ptr)->commonNativeInterfaces).
               ptr;
      PVar13 = 0x288;
    }
    else {
      if (iVar1 != 0xfe) goto LAB_00bd0774;
      Memory::WriteBarrierPtr<Js::JavascriptFunction>::WriteBarrierSet
                (&(this_00->super_JavascriptLibraryBase).mathMax,(JavascriptFunction *)pSVar10);
      object = (((((local_38->super_ScriptContextBase).javascriptLibrary)->
                 super_JavascriptLibraryBase).engineInterfaceObject.ptr)->commonNativeInterfaces).
               ptr;
      PVar13 = 0x289;
    }
  }
  else {
    if (iVar2 != 0) goto LAB_00bd0774;
    if (iVar1 == 399) {
      Memory::WriteBarrierPtr<Js::JavascriptFunction>::WriteBarrierSet
                (&this_00->arrayPrototypeValuesFunction,(JavascriptFunction *)pSVar10);
      PVar13 = 0x14;
      object = local_48;
    }
    else if (iVar1 == 0x89) {
      PVar13 = 0x284;
      object = (((((local_38->super_ScriptContextBase).javascriptLibrary)->
                 super_JavascriptLibraryBase).engineInterfaceObject.ptr)->commonNativeInterfaces).
               ptr;
    }
    else if (iVar1 == 0x93) {
      PVar13 = 0x285;
      object = (((((local_38->super_ScriptContextBase).javascriptLibrary)->
                 super_JavascriptLibraryBase).engineInterfaceObject.ptr)->commonNativeInterfaces).
               ptr;
    }
    else {
      if (iVar1 != 0xb9) {
        if (iVar1 == 0xcf) {
          this = &(this_00->super_JavascriptLibraryBase).arrayPrototypeKeysFunction;
        }
        else {
          if (iVar1 == 300) {
            PVar13 = 0x287;
            object = (((((local_38->super_ScriptContextBase).javascriptLibrary)->
                       super_JavascriptLibraryBase).engineInterfaceObject.ptr)->
                     commonNativeInterfaces).ptr;
            goto LAB_00bd076c;
          }
          if (iVar1 != 0x7a) goto LAB_00bd0774;
          this = &(this_00->super_JavascriptLibraryBase).arrayPrototypeEntriesFunction;
        }
        Memory::WriteBarrierPtr<Js::JavascriptFunction>::WriteBarrierSet
                  (this,(JavascriptFunction *)pSVar10);
        goto LAB_00bd0774;
      }
      PVar13 = 0x286;
      object = (((((local_38->super_ScriptContextBase).javascriptLibrary)->
                 super_JavascriptLibraryBase).engineInterfaceObject.ptr)->commonNativeInterfaces).
               ptr;
    }
  }
LAB_00bd076c:
  JavascriptLibrary::AddMember(this_00,object,PVar13,pSVar10);
LAB_00bd0774:
  return (this_00->super_JavascriptLibraryBase).undefinedValue.ptr;
}

Assistant:

Var JsBuiltInEngineInterfaceExtensionObject::EntryJsBuiltIn_RegisterFunction(RecyclableObject* function, CallInfo callInfo, ...)
    {
        EngineInterfaceObject_CommonFunctionProlog(function, callInfo);

        AssertOrFailFast(args.Info.Count == 3 && VarIs<ScriptFunction>(args.Values[2]));

        JavascriptLibrary * library = scriptContext->GetLibrary();

        // process function name and get property ID
        JavascriptString* methodString = VarTo<JavascriptString>(args.Values[1]);
        PropertyRecord* methodPropertyRecord = nullptr;
        methodString->GetPropertyRecord((PropertyRecord const **) &methodPropertyRecord, false);
        PropertyId methodPropID = methodPropertyRecord->GetPropertyId();

        DynamicObject *installTarget = nullptr;
        bool isStatic = false;
        PropertyString *classPropString = nullptr;
        JavascriptString *fullName = nullptr;
        JavascriptString *dot = library->GetDotString();
        JsBuiltInFile current = (static_cast<JsBuiltInEngineInterfaceExtensionObject*>(scriptContext->GetLibrary()
            ->GetEngineInterfaceObject()->GetEngineExtension(EngineInterfaceExtensionKind_JsBuiltIn)))->current;

        // determine what object this function is being added too
        switch (current)
        {
            #define file(class, type, obj) \
            case class##_##type: \
                isStatic = static_cast<bool>(IsTypeStatic::##type); \
                installTarget = library->Get##obj##(); \
                classPropString = scriptContext->GetPropertyString(PropertyIds::class); \
                break;
            JsBuiltIns(file)
        }

        Assert(methodString && classPropString && installTarget && methodPropID != PropertyIds::_none);

        if (isStatic)
        {
            fullName = JavascriptString::Concat3(classPropString, dot, methodString);
        }
        else
        {
            JavascriptString *dotPrototypeDot = JavascriptString::Concat3(dot, scriptContext->GetPropertyString(PropertyIds::prototype), dot);
            fullName = JavascriptString::Concat3(classPropString, dotPrototypeDot, methodString);
        }

        ScriptFunction *func = EngineInterfaceObject::CreateLibraryCodeScriptFunction(
            UnsafeVarTo<ScriptFunction>(args.Values[2]),
            fullName,
            false /* isConstructor */,
            true /* isJsBuiltIn */,
            true /* isPublic */
        );

        library->AddMember(installTarget, methodPropID, func);

        // Make function available to other internal facilities that need it
        // applicable for specific functions only - this may need review upon moving other functions into JsBuiltins
        if (current == JsBuiltInFile::Array_prototype)
        {
            switch (methodPropID)
            {
                case PropertyIds::entries:
                    library->arrayPrototypeEntriesFunction = func;
                    break;
                case PropertyIds::values:
                    library->arrayPrototypeValuesFunction = func;
                    library->AddMember(installTarget, PropertyIds::_symbolIterator, func);
                    break;
                case PropertyIds::keys:
                    library->arrayPrototypeKeysFunction = func;
                    break;
                case PropertyIds::forEach:
                    library->AddMember(scriptContext->GetLibrary()->GetEngineInterfaceObject()->GetCommonNativeInterfaces(), PropertyIds::builtInArray_prototype_forEach, func);
                    break;
                case PropertyIds::filter:
                    library->AddMember(scriptContext->GetLibrary()->GetEngineInterfaceObject()->GetCommonNativeInterfaces(), PropertyIds::builtInArray_prototype_filter, func);
                    break;
                case PropertyIds::indexOf:
                    library->AddMember(scriptContext->GetLibrary()->GetEngineInterfaceObject()->GetCommonNativeInterfaces(), PropertyIds::builtInArray_prototype_indexOf, func);
                    break;
                case PropertyIds::reduce:
                    library->AddMember(scriptContext->GetLibrary()->GetEngineInterfaceObject()->GetCommonNativeInterfaces(), PropertyIds::builtInArray_prototype_reduce, func);
                    break;
            }
        }
        else if (current == JsBuiltInFile::Math_object)
        {
            switch (methodPropID)
            {
                case PropertyIds::max:
                    library->mathMax = func;
                    library->AddMember(scriptContext->GetLibrary()->GetEngineInterfaceObject()->GetCommonNativeInterfaces(), PropertyIds::builtInMath_object_max, func);
                    break;
                case PropertyIds::min:
                    library->mathMin = func;
                    library->AddMember(scriptContext->GetLibrary()->GetEngineInterfaceObject()->GetCommonNativeInterfaces(), PropertyIds::builtInMath_object_min, func);
                    break;
            }
        }
        //Don't need to return anything
        return library->GetUndefined();
    }